

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QTransposeProxyModelPrivate::uncheckedMapFromSource
          (QModelIndex *__return_storage_ptr__,QTransposeProxyModelPrivate *this,
          QModelIndex *sourceIndex)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QObject *pQVar3;
  quintptr qVar4;
  bool bVar5;
  parameter_type pQVar6;
  
  pQVar6 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(&(this->super_QAbstractProxyModelPrivate).model);
  if ((pQVar6 != (parameter_type)0x0) && (bVar5 = QModelIndex::isValid(sourceIndex), bVar5)) {
    pQVar3 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
             super_QObjectPrivate.super_QObjectData.q_ptr;
    qVar4 = sourceIndex->i;
    uVar1 = sourceIndex->r;
    uVar2 = sourceIndex->c;
    __return_storage_ptr__->r = uVar2;
    __return_storage_ptr__->c = uVar1;
    __return_storage_ptr__->i = qVar4;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)pQVar3;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTransposeProxyModelPrivate::uncheckedMapFromSource(const QModelIndex &sourceIndex) const
{
    if (!model || !sourceIndex.isValid())
        return QModelIndex();
    Q_Q(const QTransposeProxyModel);
    return q->createIndex(sourceIndex.column(), sourceIndex.row(), sourceIndex.internalPointer());
}